

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O1

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_>::WriteAuxFiles
          (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_ExampleNLFeeder>_> *this,
          string *namebase)

{
  WriteRowObjNames(this,namebase);
  WriteRowDelNames(this,namebase);
  WriteColNames(this,namebase);
  WriteUnusedVarNames(this,namebase);
  WriteFixedVars(this,namebase);
  (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.max_var_name_len =
       this->maxLen_UnvName_ + this->maxLen_ColName_ + this->maxLen_FixName_;
  WriteObjAdj(this,namebase);
  return;
}

Assistant:

void NLWriter2<Params>::WriteAuxFiles(
    const std::string& namebase) {
  WriteRowObjNames(namebase);
  WriteRowDelNames(namebase);
  WriteColNames(namebase);
  WriteUnusedVarNames(namebase);
  WriteFixedVars(namebase);
  header_.max_var_name_len =     // maxLen_FixName_ can be longer
      maxLen_ColName_ + maxLen_UnvName_ + maxLen_FixName_;
  WriteObjAdj(namebase);
}